

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zero_copy_stream_unittest.cc
# Opt level: O1

void __thiscall
google::protobuf::io::anon_unknown_0::
CordOutputStreamTest_DonatePartialCordBufferAndUseExtraCapacity_Test::TestBody
          (CordOutputStreamTest_DonatePartialCordBufferAndUseExtraCapacity_Test *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  undefined1 *puVar2;
  byte bVar3;
  undefined1 auVar4 [12];
  bool bVar5;
  CordRepFlat *pCVar6;
  undefined8 *puVar7;
  undefined8 extraout_RAX;
  sbyte sVar8;
  sbyte sVar9;
  ulong uVar10;
  pointer *__ptr_2;
  long lVar11;
  undefined1 *puVar12;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__ptr_00;
  uint uVar13;
  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *this_00;
  int iVar14;
  char *pcVar15;
  pointer message;
  char *pcVar16;
  int iVar17;
  pointer *__ptr;
  Span<char> SVar18;
  AssertionResult gtest_ar;
  AssertionResult gtest_ar_;
  CordBuffer buffer;
  int size;
  Cord cord;
  AssertionResult gtest_ar_2;
  void *data;
  void *next_available_data;
  void *available_data;
  CordOutputStream output;
  undefined1 local_128 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbStack_120;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_118;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_108;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_100;
  undefined1 *local_f8 [2];
  anon_union_16_2_b9f6da03_for_Rep_1 local_e8;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_d8;
  long local_d0;
  undefined1 *local_c8 [2];
  int local_b4;
  undefined1 local_b0 [8];
  undefined1 auStack_a8 [16];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_98;
  undefined1 local_90 [16];
  void *local_80;
  anon_union_16_2_b9f6da03_for_Rep_1 local_78;
  char *local_60;
  char *local_58;
  CordOutputStream local_50;
  
  pCVar6 = absl::lts_20250127::cord_internal::CordRepFlat::NewImpl<4096ul>(500);
  (pCVar6->super_CordRep).length = 0;
  local_e8.short_rep.raw_size = (char)pCVar6;
  local_e8._1_7_ = (undefined7)((ulong)pCVar6 >> 8);
  if (((ulong)pCVar6 & 1) == 0) {
    SVar18 = absl::lts_20250127::CordBuffer::Rep::long_available((Rep *)&local_e8.long_rep);
    auVar4 = SVar18._0_12_;
  }
  else {
    SVar18 = absl::lts_20250127::CordBuffer::Rep::short_available((Rep *)&local_e8.long_rep);
    auVar4 = SVar18._0_12_;
  }
  local_58 = auVar4._0_8_;
  builtin_strncpy(local_58,
                  "aaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaa"
                  ,100);
  if ((local_e8.short_rep.raw_size & 1U) != 0) {
LAB_00b5c913:
    io::_GLOBAL__N_1::CordOutputStreamTest_DonatePartialCordBufferAndUseExtraCapacity_Test::TestBody
              ();
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_d8);
    if (local_108._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_108._M_head_impl + 8))();
    }
    local_108._M_head_impl =
         (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    if (pbStack_120 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&pbStack_120,pbStack_120);
    }
    pbStack_120 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    absl::lts_20250127::Cord::~Cord((Cord *)local_b0);
    CordOutputStream::~CordOutputStream(&local_50);
    absl::lts_20250127::CordBuffer::~CordBuffer((CordBuffer *)&local_e8.long_rep);
    _Unwind_Resume(extraout_RAX);
  }
  bVar3 = *(byte *)(CONCAT71(local_e8._1_7_,local_e8.short_rep.raw_size) + 0xc);
  uVar13 = 0xfff48000;
  if (bVar3 < 0xbb) {
    uVar13 = 0xfffff180;
  }
  sVar9 = 0xc;
  if (bVar3 < 0xbb) {
    sVar9 = 6;
  }
  pcVar16 = (char *)0xfffffff0;
  if (0x42 < bVar3) {
    pcVar16 = (char *)(ulong)uVar13;
  }
  sVar8 = 3;
  if (0x42 < bVar3) {
    sVar8 = sVar9;
  }
  if ((((uint)bVar3 << sVar8) + (int)pcVar16) - 0xd < 100) goto LAB_00b5c913;
  if ((local_e8.short_rep.raw_size & 1U) == 0) {
    lVar11 = *(long *)CONCAT71(local_e8._1_7_,local_e8.short_rep.raw_size);
  }
  else {
    lVar11 = (long)(local_e8.short_rep.raw_size >> 1);
  }
  uVar10 = 0xf;
  if ((local_e8.short_rep.raw_size & 1U) == 0) {
    bVar3 = *(byte *)(CONCAT71(local_e8._1_7_,local_e8.short_rep.raw_size) + 0xc);
    iVar14 = -0xb8000;
    if (bVar3 < 0xbb) {
      iVar14 = -0xe80;
    }
    pcVar16 = &DAT_0000000c;
    if (bVar3 < 0xbb) {
      pcVar16 = &DAT_00000006;
    }
    iVar17 = -0x10;
    if (0x42 < bVar3) {
      iVar17 = iVar14;
    }
    sVar9 = 3;
    if (0x42 < bVar3) {
      sVar9 = (sbyte)pcVar16;
    }
    uVar10 = (ulong)(int)(((uint)bVar3 << sVar9) + iVar17 + -0xd);
  }
  if (uVar10 < lVar11 + 100U) goto LAB_00b5c913;
  if ((local_e8.short_rep.raw_size & 1U) == 0) {
    *(long *)CONCAT71(local_e8._1_7_,local_e8.short_rep.raw_size) =
         *(long *)CONCAT71(local_e8._1_7_,local_e8.short_rep.raw_size) + 100;
  }
  else {
    local_e8.short_rep.raw_size = local_e8.short_rep.raw_size - 0x38;
  }
  local_60 = local_58 + 100;
  local_78.short_rep.raw_size = local_e8.short_rep.raw_size;
  local_78._1_7_ = local_e8._1_7_;
  local_78._9_4_ = local_e8._9_4_;
  local_78._13_2_ = local_e8._13_2_;
  local_78.short_rep.data[0xe] = local_e8.short_rep.data[0xe];
  local_e8.short_rep.raw_size = 1;
  CordOutputStream::CordOutputStream(&local_50,(CordBuffer *)&local_78.long_rep,0);
  if ((local_78.short_rep.raw_size & 1U) == 0) {
    absl::lts_20250127::cord_internal::CordRepFlat::Delete
              ((CordRep *)CONCAT71(local_78._1_7_,local_78.short_rep.raw_size));
  }
  bVar5 = CordOutputStream::Next(&local_50,&local_80,&local_b4);
  local_108._M_head_impl._0_1_ = bVar5;
  local_100 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (!bVar5) {
    testing::Message::Message((Message *)&local_d8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_128,(internal *)&local_108,
               (AssertionResult *)"output.Next(&data, &size)","false","true",pcVar16);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_b0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/zero_copy_stream_unittest.cc"
               ,0x417,(char *)local_128);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_b0,(Message *)&local_d8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_b0);
    if (local_128 != (undefined1  [8])&local_118) {
      operator_delete((void *)local_128,local_118._M_allocated_capacity + 1);
    }
    if (local_d8._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(undefined1 **)local_d8._M_head_impl + 8))();
    }
  }
  if (local_100 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_100,local_100);
  }
  testing::internal::CmpHelperEQ<void*,void*>
            ((internal *)local_128,"data","next_available_data",&local_80,&local_60);
  if (local_128[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_108);
    if (pbStack_120 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar15 = anon_var_dwarf_a12c75 + 5;
    }
    else {
      pcVar15 = (pbStack_120->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_d8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/zero_copy_stream_unittest.cc"
               ,0x418,pcVar15);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_d8,(Message *)&local_108);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_d8);
    if (local_108._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_108._M_head_impl + 8))();
    }
  }
  if (pbStack_120 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&pbStack_120,pbStack_120);
  }
  local_108._M_head_impl._0_4_ = auVar4._8_4_ + -100;
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)local_128,"size","static_cast<int>(available.size() - 100)",&local_b4,
             (int *)&local_108);
  if (local_128[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_108);
    if (pbStack_120 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar15 = anon_var_dwarf_a12c75 + 5;
    }
    else {
      pcVar15 = (pbStack_120->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_d8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/zero_copy_stream_unittest.cc"
               ,0x419,pcVar15);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_d8,(Message *)&local_108);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_d8);
    if (local_108._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_108._M_head_impl + 8))();
    }
  }
  if (pbStack_120 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&pbStack_120,pbStack_120);
  }
  memset(local_80,0x62,(long)local_b4);
  CordOutputStream::Consume((CordOutputStream *)local_b0);
  bVar5 = true;
  if ((Nonnull<CordRep_*>)auStack_a8._0_8_ != (Nonnull<CordRep_*>)0x0 && (local_b0[0] & 1) != 0) {
    local_128 = (undefined1  [8])0x0;
    pbStack_120 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    bVar5 = absl::lts_20250127::Cord::GetFlatAux
                      ((Nonnull<CordRep_*>)auStack_a8._0_8_,(Nonnull<absl::string_view_*>)local_128)
    ;
  }
  local_108._M_head_impl._0_1_ = bVar5;
  local_100 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (bVar5 == false) {
    this_00 = (default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)&local_100;
    testing::Message::Message((Message *)&local_d8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_128,(internal *)&local_108,(AssertionResult *)"cord.TryFlat()",
               "false","true",pcVar16);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_90,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/zero_copy_stream_unittest.cc"
               ,0x41d,(char *)local_128);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_90,(Message *)&local_d8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_90);
    if (local_128 != (undefined1  [8])&local_118) {
      operator_delete((void *)local_128,local_118._M_allocated_capacity + 1);
    }
    if (local_d8._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(undefined1 **)local_d8._M_head_impl + 8))();
    }
    __ptr_00 = local_100;
    if (local_100 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
    goto LAB_00b5c8c7;
  }
  else {
    if ((Nonnull<CordRep_*>)auStack_a8._0_8_ == (Nonnull<CordRep_*>)0x0 ||
        ((long)(char)local_b0[0] & 1U) == 0) {
      if ((local_b0[0] & 1) == 0) {
        local_90._0_8_ =
             (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)((ulong)(long)(char)local_b0[0] >> 1);
        local_90._8_8_ =
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(local_b0 + 1);
      }
      else {
        local_90._0_8_ =
             *(anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               **)auStack_a8._0_8_;
        local_90._8_8_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      }
    }
    else {
      local_128 = (undefined1  [8])0x0;
      pbStack_120 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      absl::lts_20250127::Cord::GetFlatAux
                ((Nonnull<CordRep_*>)auStack_a8._0_8_,(Nonnull<absl::string_view_*>)local_128);
      local_90._0_8_ = local_128;
      local_90._8_8_ = pbStack_120;
    }
    local_108._M_head_impl =
         (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_f8;
    std::__cxx11::string::_M_construct((ulong)&local_108,'d');
    local_d8._M_head_impl =
         (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_c8;
    std::__cxx11::string::_M_construct((ulong)&local_d8,(char)local_b4);
    puVar2 = (undefined1 *)((long)&(local_100->_M_dataplus)._M_p + local_d0);
    puVar12 = &DAT_0000000f;
    if (local_108._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_f8) {
      puVar12 = local_f8[0];
    }
    if (puVar12 < puVar2) {
      puVar12 = &DAT_0000000f;
      if (local_d8._M_head_impl !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_c8) {
        puVar12 = local_c8[0];
      }
      if (puVar12 < puVar2) goto LAB_00b5c6c1;
      puVar7 = (undefined8 *)
               std::__cxx11::string::replace
                         ((ulong)&local_d8,0,(char *)0x0,(ulong)local_108._M_head_impl);
    }
    else {
LAB_00b5c6c1:
      puVar7 = (undefined8 *)
               std::__cxx11::string::_M_append((char *)&local_108,(ulong)local_d8._M_head_impl);
    }
    local_128 = (undefined1  [8])&local_118;
    paVar1 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)(puVar7 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*puVar7 == paVar1) {
      local_118._M_allocated_capacity = paVar1->_M_allocated_capacity;
      local_118._8_8_ = puVar7[3];
    }
    else {
      local_118._M_allocated_capacity = paVar1->_M_allocated_capacity;
      local_128 = (undefined1  [8])*puVar7;
    }
    pbStack_120 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)puVar7[1];
    *puVar7 = paVar1;
    puVar7[1] = 0;
    paVar1->_M_local_buf[0] = '\0';
    testing::internal::
    CmpHelperEQ<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>
              ((internal *)(auStack_a8 + 8),"flat",
               "std::string(100, \'a\') + std::string(static_cast<size_t>(size), \'b\')",
               (basic_string_view<char,_std::char_traits<char>_> *)local_90,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_128);
    if (local_128 != (undefined1  [8])&local_118) {
      operator_delete((void *)local_128,local_118._M_allocated_capacity + 1);
    }
    if (local_d8._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_c8) {
      operator_delete(local_d8._M_head_impl,(ulong)(local_c8[0] + 1));
    }
    if (local_108._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_f8) {
      operator_delete(local_108._M_head_impl,(ulong)(local_f8[0] + 1));
    }
    if (auStack_a8[8] == '\0') {
      testing::Message::Message((Message *)local_128);
      if (local_98 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar16 = anon_var_dwarf_a12c75 + 5;
      }
      else {
        pcVar16 = (local_98->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&local_108,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/zero_copy_stream_unittest.cc"
                 ,0x420,pcVar16);
      testing::internal::AssertHelper::operator=((AssertHelper *)&local_108,(Message *)local_128);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_108);
      if (local_128 != (undefined1  [8])0x0) {
        (**(code **)(*(size_type *)local_128 + 8))();
      }
    }
    if (local_98 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_98,local_98);
    }
    local_108._M_head_impl =
         (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_90._8_8_;
    testing::internal::CmpHelperEQ<char_const*,void*>
              ((internal *)local_128,"flat.data()","available_data",(char **)&local_108,&local_58);
    if (local_128[0] == (internal)0x0) {
      testing::Message::Message((Message *)&local_108);
      if (pbStack_120 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        message = anon_var_dwarf_a12c75 + 5;
      }
      else {
        message = (pbStack_120->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&local_d8,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/zero_copy_stream_unittest.cc"
                 ,0x421,message);
      testing::internal::AssertHelper::operator=((AssertHelper *)&local_d8,(Message *)&local_108);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_d8);
      if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
          local_108._M_head_impl !=
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        (**(code **)(*(long *)local_108._M_head_impl + 8))();
      }
    }
    if (pbStack_120 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
    goto LAB_00b5c8c7;
    this_00 = (default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)&pbStack_120;
    __ptr_00 = pbStack_120;
  }
  std::
  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  operator()(this_00,__ptr_00);
LAB_00b5c8c7:
  absl::lts_20250127::Cord::~Cord((Cord *)local_b0);
  if ((local_50.buffer_.rep_.field_0.short_rep.raw_size & 1U) == 0) {
    absl::lts_20250127::cord_internal::CordRepFlat::Delete
              ((CordRep *)
               CONCAT71(local_50.buffer_.rep_.field_0._1_7_,
                        local_50.buffer_.rep_.field_0.short_rep.raw_size));
  }
  absl::lts_20250127::Cord::~Cord(&local_50.cord_);
  if ((local_e8.short_rep.raw_size & 1U) == 0) {
    absl::lts_20250127::cord_internal::CordRepFlat::Delete
              ((CordRep *)CONCAT71(local_e8._1_7_,local_e8.short_rep.raw_size));
  }
  return;
}

Assistant:

bool IoTest::WriteToOutput(ZeroCopyOutputStream* output, const void* data,
                           int size) {
  const uint8_t* in = reinterpret_cast<const uint8_t*>(data);
  int in_size = size;

  void* out;
  int out_size;

  while (true) {
    if (!output->Next(&out, &out_size)) {
      return false;
    }
    EXPECT_GT(out_size, 0);

    if (in_size <= out_size) {
      memcpy(out, in, in_size);
      output->BackUp(out_size - in_size);
      return true;
    }

    memcpy(out, in, out_size);
    in += out_size;
    in_size -= out_size;
  }
}